

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void google::protobuf::util::converter::ProtoStreamObjectWriter::InitRendererMap(void)

{
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var1;
  mapped_type *pp_Var2;
  key_type local_48;
  allocator local_21;
  
  p_Var1 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            *)operator_new(0x38);
  *(undefined8 *)(p_Var1 + 0x20) = 0;
  *(undefined8 *)(p_Var1 + 0x28) = 0;
  *(_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    **)p_Var1 = p_Var1 + 0x30;
  *(undefined8 *)(p_Var1 + 8) = 1;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined4 *)(p_Var1 + 0x20) = 0x3f800000;
  *(undefined8 *)(p_Var1 + 0x28) = 0;
  *(undefined8 *)(p_Var1 + 0x30) = 0;
  renderers__abi_cxx11_ = p_Var1;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Timestamp",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderTimestamp;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Duration",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderDuration;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.FieldMask",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderFieldMask;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Double",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Float",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Int64",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.UInt64",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Int32",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.UInt32",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Bool",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.String",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Bytes",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.DoubleValue",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.FloatValue",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Int64Value",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.UInt64Value",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Int32Value",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.UInt32Value",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.BoolValue",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.StringValue",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.BytesValue",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderWrapperType;
  std::__cxx11::string::~string((string *)&local_48);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string
            ((string *)&local_48,"type.googleapis.com/google.protobuf.Value",&local_21);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_48);
  *pp_Var2 = RenderStructValue;
  std::__cxx11::string::~string((string *)&local_48);
  protobuf::internal::OnShutdown(DeleteRendererMap);
  return;
}

Assistant:

void ProtoStreamObjectWriter::InitRendererMap() {
  renderers_ = new std::unordered_map<std::string,
                                      ProtoStreamObjectWriter::TypeRenderer>();
  (*renderers_)["type.googleapis.com/google.protobuf.Timestamp"] =
      &ProtoStreamObjectWriter::RenderTimestamp;
  (*renderers_)["type.googleapis.com/google.protobuf.Duration"] =
      &ProtoStreamObjectWriter::RenderDuration;
  (*renderers_)["type.googleapis.com/google.protobuf.FieldMask"] =
      &ProtoStreamObjectWriter::RenderFieldMask;
  (*renderers_)["type.googleapis.com/google.protobuf.Double"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Float"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Int64"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.UInt64"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Int32"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.UInt32"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Bool"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.String"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Bytes"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.DoubleValue"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.FloatValue"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Int64Value"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.UInt64Value"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Int32Value"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.UInt32Value"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.BoolValue"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.StringValue"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.BytesValue"] =
      &ProtoStreamObjectWriter::RenderWrapperType;
  (*renderers_)["type.googleapis.com/google.protobuf.Value"] =
      &ProtoStreamObjectWriter::RenderStructValue;
  ::google::protobuf::internal::OnShutdown(&DeleteRendererMap);
}